

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_update_image_dimensions(opj_image_t *p_image,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_INT32 OVar2;
  OPJ_INT32 OVar3;
  OPJ_INT32 OVar4;
  uint uVar5;
  OPJ_INT32 l_w;
  OPJ_INT32 l_h;
  opj_image_comp_t *l_img_comp;
  OPJ_INT32 l_comp_y1;
  OPJ_INT32 l_comp_x1;
  OPJ_UINT32 it_comp;
  opj_event_mgr_t *p_manager_local;
  opj_image_t *p_image_local;
  
  _l_w = p_image->comps;
  l_comp_y1 = 0;
  while( true ) {
    if (p_image->numcomps <= (uint)l_comp_y1) {
      return 1;
    }
    OVar1 = opj_int_ceildiv(p_image->x0,_l_w->dx);
    _l_w->x0 = OVar1;
    OVar1 = opj_int_ceildiv(p_image->y0,_l_w->dy);
    _l_w->y0 = OVar1;
    OVar2 = opj_int_ceildiv(p_image->x1,_l_w->dx);
    OVar3 = opj_int_ceildiv(p_image->y1,_l_w->dy);
    OVar2 = opj_int_ceildivpow2(OVar2,_l_w->factor);
    OVar4 = opj_int_ceildivpow2(_l_w->x0,_l_w->factor);
    uVar5 = OVar2 - OVar4;
    if ((int)uVar5 < 0) break;
    _l_w->w = uVar5;
    OVar2 = opj_int_ceildivpow2(OVar3,_l_w->factor);
    OVar3 = opj_int_ceildivpow2(_l_w->y0,_l_w->factor);
    uVar5 = OVar2 - OVar3;
    if ((int)uVar5 < 0) {
      opj_event_msg(p_manager,1,
                    "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n",
                    (ulong)(uint)l_comp_y1,(ulong)uVar5);
      return 0;
    }
    _l_w->h = uVar5;
    _l_w = _l_w + 1;
    l_comp_y1 = l_comp_y1 + 1;
  }
  opj_event_msg(p_manager,1,"Size x of the decoded component image is incorrect (comp[%d].w=%d).\n",
                (ulong)(uint)l_comp_y1,(ulong)uVar5);
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_update_image_dimensions(opj_image_t* p_image,
        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 it_comp;
    OPJ_INT32 l_comp_x1, l_comp_y1;
    opj_image_comp_t* l_img_comp = NULL;

    l_img_comp = p_image->comps;
    for (it_comp = 0; it_comp < p_image->numcomps; ++it_comp) {
        OPJ_INT32 l_h, l_w;

        l_img_comp->x0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->x0,
                         (OPJ_INT32)l_img_comp->dx);
        l_img_comp->y0 = (OPJ_UINT32)opj_int_ceildiv((OPJ_INT32)p_image->y0,
                         (OPJ_INT32)l_img_comp->dy);
        l_comp_x1 = opj_int_ceildiv((OPJ_INT32)p_image->x1, (OPJ_INT32)l_img_comp->dx);
        l_comp_y1 = opj_int_ceildiv((OPJ_INT32)p_image->y1, (OPJ_INT32)l_img_comp->dy);

        l_w = opj_int_ceildivpow2(l_comp_x1, (OPJ_INT32)l_img_comp->factor)
              - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->x0, (OPJ_INT32)l_img_comp->factor);
        if (l_w < 0) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Size x of the decoded component image is incorrect (comp[%d].w=%d).\n",
                          it_comp, l_w);
            return OPJ_FALSE;
        }
        l_img_comp->w = (OPJ_UINT32)l_w;

        l_h = opj_int_ceildivpow2(l_comp_y1, (OPJ_INT32)l_img_comp->factor)
              - opj_int_ceildivpow2((OPJ_INT32)l_img_comp->y0, (OPJ_INT32)l_img_comp->factor);
        if (l_h < 0) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n",
                          it_comp, l_h);
            return OPJ_FALSE;
        }
        l_img_comp->h = (OPJ_UINT32)l_h;

        l_img_comp++;
    }

    return OPJ_TRUE;
}